

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *
dynet::allocate_shadow_parameters(ParameterCollection *m)

{
  bool bVar1;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this_00;
  ParameterStorage *in_RDI;
  ParameterStorage **p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *__range1;
  vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *v;
  ParameterStorage *__args;
  __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
  in_stack_ffffffffffffffc8;
  vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>
  *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::vector
            ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)0xda1955);
  this = ParameterCollection::parameters_list((ParameterCollection *)0xda195f);
  std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::size(this);
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  this_00 = ParameterCollection::parameters_list((ParameterCollection *)0xda1989);
  std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::begin(this_00)
  ;
  std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                             *)this_00), bVar1) {
    __gnu_cxx::
    __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
    ::operator*((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<dynet::ShadowParameters,std::allocator<dynet::ShadowParameters>>::
    emplace_back<dynet::ParameterStorage&>
              ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)this,
               __args);
    __gnu_cxx::
    __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
    ::operator++((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)__args;
}

Assistant:

vector<ShadowParameters> allocate_shadow_parameters(const ParameterCollection& m) {
  vector<ShadowParameters> v;
  v.reserve(m.parameters_list().size());
  for (auto& p : m.parameters_list())
    v.emplace_back(*p);
  return v;
}